

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTransaction::RemoveTxOut(AbstractTransaction *this,uint32_t index)

{
  CfdException *this_00;
  undefined4 in_register_00000034;
  allocator local_3d;
  int ret;
  string local_38;
  
  (*this->_vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x228,"RemoveTxOut");
  ret = wally_tx_remove_output((wally_tx *)this->wally_tx_pointer_,(ulong)index);
  if (ret == 0) {
    return;
  }
  local_38._M_dataplus._M_p = "cfdcore_transaction_common.cpp";
  local_38._M_string_length._0_4_ = 0x22d;
  local_38.field_2._M_allocated_capacity = (long)"AddTxOut_RemoveTxOut" + 9;
  logger::warn<int&>((CfdSourceLocation *)&local_38,"wally_tx_remove_output NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_38,"vout remove error.",&local_3d);
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::RemoveTxOut(uint32_t index) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  int ret = wally_tx_remove_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), index);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_remove_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout remove error.");
  }
}